

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O1

shared_ptr<BER_CONTAINER> __thiscall Counter32Callback::buildTypeWithValue(Counter32Callback *this)

{
  undefined4 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  SortableOIDType *pSVar2;
  undefined **in_RDX;
  long in_RSI;
  shared_ptr<BER_CONTAINER> sVar3;
  
  puVar1 = *(undefined4 **)(in_RSI + 0x18);
  if (puVar1 == (undefined4 *)0x0) {
    (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)0x0;
    (this->super_ValueCallback).OID = (SortableOIDType *)0x0;
  }
  else {
    pSVar2 = (SortableOIDType *)operator_new(0x28);
    (pSVar2->super_OIDType).super_BER_CONTAINER._type = 1;
    (pSVar2->super_OIDType).super_BER_CONTAINER._length = 1;
    (pSVar2->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00115ce0;
    *(undefined4 *)&(pSVar2->super_OIDType)._value._M_string_length = *puVar1;
    in_RDX = &PTR__BER_CONTAINER_00115020;
    *(undefined ***)&(pSVar2->super_OIDType).valid = &PTR__BER_CONTAINER_00115020;
    (pSVar2->super_OIDType)._value._M_dataplus._M_p = (pointer)0x41;
    (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)&(pSVar2->super_OIDType).valid;
    (this->super_ValueCallback).OID = pSVar2;
  }
  sVar3.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
  sVar3.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar3.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> Counter32Callback::buildTypeWithValue(){
    ASSERT_VALID_VALUE(this->value);

    return std::make_shared<Counter32>(*this->value);
}